

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

mat4 * __thiscall
graphics101::Mesh::normalizingTransformation(mat4 *__return_storage_ptr__,Mesh *this)

{
  float *s;
  float local_10;
  float local_c;
  
  if ((this->positions).
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->positions).
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    s = &local_c;
  }
  else {
    s = &local_10;
  }
  *s = 1.0;
  glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

mat4 Mesh::normalizingTransformation() const {
    // Your code goes here.
    
    // If there are no positions, return the identity.
    if( positions.empty() ) {
        return mat4(1.0);
    }
    
    // The identity matrix.
    // Replace this with your implementation.
    return mat4(1.0);
}